

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeVariability
          (AsciiParser *this,Variability *variability,bool *varying_authored)

{
  ulong uVar1;
  bool bVar2;
  string tok;
  string local_40;
  
  bVar2 = SkipWhitespace(this);
  if (bVar2) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    uVar1 = this->_sr->idx_;
    bVar2 = ReadIdentifier(this,&local_40);
    if (bVar2) {
      bVar2 = ::std::operator==(&local_40,"uniform");
      if (bVar2) {
        *variability = Uniform;
        *varying_authored = false;
      }
      else {
        bVar2 = ::std::operator==(&local_40,"varying");
        if (bVar2) {
          *variability = Varying;
          *varying_authored = true;
        }
        else {
          *varying_authored = false;
          if (uVar1 <= this->_sr->length_) {
            this->_sr->idx_ = uVar1;
          }
        }
      }
      bVar2 = SkipWhitespace(this);
    }
    else {
      if (uVar1 <= this->_sr->length_) {
        this->_sr->idx_ = uVar1;
      }
      bVar2 = false;
    }
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AsciiParser::MaybeVariability(tinyusdz::Variability *variability,
                                   bool *varying_authored) {
  if (!SkipWhitespace()) {
    return false;
  }

  std::string tok;

  auto loc = CurrLoc();
  if (!ReadIdentifier(&tok)) {
    SeekTo(loc);
    return false;
  }

  if (tok == "uniform") {
    (*variability) = tinyusdz::Variability::Uniform;
    (*varying_authored) = false;
  } else if (tok == "varying") {
    (*variability) = tinyusdz::Variability::Varying;
    (*varying_authored) = true;
  } else {
    (*varying_authored) = false;
    // rewind
    SeekTo(loc);
  }

  if (!SkipWhitespace()) {
    return false;
  }

  return true;
}